

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_bs.c
# Opt level: O0

int jpc_bitstream_inalign(jpc_bitstream_t *bitstream,int fillmask,int filldata)

{
  char cVar1;
  long lVar2;
  int local_34;
  int m;
  int numfill;
  int u;
  int v;
  int n;
  int filldata_local;
  int fillmask_local;
  jpc_bitstream_t *bitstream_local;
  
  local_34 = 0;
  numfill = 0;
  if (bitstream->cnt_ < 1) {
    if (bitstream->cnt_ == 0) {
      u = 0;
      if ((bitstream->buf_ & 0xff) == 0xff) {
        u = 7;
      }
    }
    else {
      u = 0;
    }
  }
  else {
    u = bitstream->cnt_;
  }
  if (0 < u) {
    lVar2 = jpc_bitstream_getbits(bitstream,u);
    if ((int)(uint)lVar2 < 0) {
      return -1;
    }
    local_34 = u;
    numfill = 0 << ((byte)u & 0x1f) | (uint)lVar2;
  }
  if ((bitstream->buf_ & 0xff) == 0xff) {
    lVar2 = jpc_bitstream_getbits(bitstream,7);
    if ((int)(uint)lVar2 < 0) {
      return -1;
    }
    numfill = numfill << 7 | (uint)lVar2;
    local_34 = local_34 + 7;
  }
  cVar1 = (char)local_34;
  if (local_34 < 8) {
    v = filldata >> (7U - cVar1 & 0x1f);
    n = fillmask >> (7U - cVar1 & 0x1f);
  }
  else {
    numfill = numfill >> (cVar1 - 7U & 0x1f);
    v = filldata;
    n = fillmask;
  }
  bitstream_local._4_4_ = (uint)(((numfill ^ v ^ 0xffffffffU) & n) != n);
  return bitstream_local._4_4_;
}

Assistant:

int jpc_bitstream_inalign(jpc_bitstream_t *bitstream, int fillmask,
  int filldata)
{
	int n;
	int v;
	int u;
	int numfill;
	int m;

	numfill = 7;
	m = 0;
	v = 0;
	if (bitstream->cnt_ > 0) {
		n = bitstream->cnt_;
	} else if (!bitstream->cnt_) {
		n = ((bitstream->buf_ & 0xff) == 0xff) ? 7 : 0;
	} else {
		n = 0;
	}
	if (n > 0) {
		if ((u = jpc_bitstream_getbits(bitstream, n)) < 0) {
			return -1;
		}
		m += n;
		v = (v << n) | u;
	}
	if ((bitstream->buf_ & 0xff) == 0xff) {
		if ((u = jpc_bitstream_getbits(bitstream, 7)) < 0) {
			return -1;
		}
		v = (v << 7) | u;
		m += 7;
	}
	if (m > numfill) {
		v >>= m - numfill;
	} else {
		filldata >>= numfill - m;
		fillmask >>= numfill - m;
	}
	if (((~(v ^ filldata)) & fillmask) != fillmask) {
		/* The actual fill pattern does not match the expected one. */
		return 1;
	}

	return 0;
}